

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O1

void __thiscall
woff2::anon_unknown_2::GlyfEncoder::WriteBbox(GlyfEncoder *this,int glyph_id,Glyph *glyph)

{
  byte *pbVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out;
  
  pbVar1 = (this->bbox_bitmap_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start + (glyph_id >> 3);
  *pbVar1 = *pbVar1 | (byte)(0x80 >> ((byte)glyph_id & 7));
  out = &this->bbox_stream_;
  WriteUShort(out,(int)glyph->x_min);
  WriteUShort(out,(int)glyph->y_min);
  WriteUShort(out,(int)glyph->x_max);
  WriteUShort(out,(int)glyph->y_max);
  return;
}

Assistant:

void WriteBbox(int glyph_id, const Glyph& glyph) {
    bbox_bitmap_[glyph_id >> 3] |= 0x80 >> (glyph_id & 7);
    WriteUShort(&bbox_stream_, glyph.x_min);
    WriteUShort(&bbox_stream_, glyph.y_min);
    WriteUShort(&bbox_stream_, glyph.x_max);
    WriteUShort(&bbox_stream_, glyph.y_max);
  }